

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O2

void anon_unknown.dwarf_e668::AudioState::EventCallback
               (ALenum eventType,ALuint object,ALuint param,ALsizei length,ALchar *message,
               void *userParam)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  long *plVar4;
  char *pcVar5;
  unique_lock<std::mutex> local_50;
  unique_lock<std::mutex> local_40;
  
  if (eventType == 0x19a4) {
    std::unique_lock<std::mutex>::unique_lock(&local_50,(mutex_type *)((long)userParam + 0x148));
    std::unique_lock<std::mutex>::unlock(&local_50);
    std::unique_lock<std::mutex>::~unique_lock(&local_50);
    goto LAB_0010926e;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"\n---- AL Event on AudioState ");
  poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
  std::operator<<(poVar3," ----\nEvent: ");
  if (eventType == 0x19a6) {
    pcVar5 = "Disconnected";
LAB_00109140:
    std::operator<<((ostream *)&std::cout,pcVar5);
  }
  else {
    if (eventType == 0x19a5) {
      pcVar5 = "Source state changed";
      goto LAB_00109140;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"0x");
    lVar1 = *(long *)poVar3;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar3 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
    poVar3 = std::operator<<(poVar3,0x30);
    plVar4 = (long *)std::ostream::operator<<((ostream *)poVar3,eventType);
    lVar1 = *plVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)((long)plVar4 + lVar2 + 0x18) = *(uint *)((long)plVar4 + lVar2 + 0x18) & 0xffffffb5 | 2
    ;
    *(undefined8 *)((long)plVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 0;
    std::operator<<(plVar4,0x20);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"\nObject ID: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"\nParameter: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"\nMessage: ");
  local_50._M_device = (mutex_type *)&local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,message,message + (uint)length);
  poVar3 = std::operator<<(poVar3,(string *)&local_50);
  poVar3 = std::operator<<(poVar3,"\n----");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_50);
  if (eventType != 0x19a6) {
    return;
  }
  std::mutex::lock((mutex *)&((pthread_mutex_t *)((long)userParam + 0x148))->__data);
  *(undefined1 *)((long)userParam + 0x1a0) = 0;
  pthread_mutex_unlock((pthread_mutex_t *)((long)userParam + 0x148));
LAB_0010926e:
  std::condition_variable::notify_one();
  return;
}

Assistant:

void AL_APIENTRY AudioState::EventCallback(ALenum eventType, ALuint object, ALuint param,
    ALsizei length, const ALchar *message, void *userParam)
{
    auto self = static_cast<AudioState*>(userParam);

    if(eventType == AL_EVENT_TYPE_BUFFER_COMPLETED_SOFT)
    {
        /* Temporarily lock the source mutex to ensure it's not between
         * checking the processed count and going to sleep.
         */
        std::unique_lock<std::mutex>{self->mSrcMutex}.unlock();
        self->mSrcCond.notify_one();
        return;
    }

    std::cout<< "\n---- AL Event on AudioState "<<self<<" ----\nEvent: ";
    switch(eventType)
    {
    case AL_EVENT_TYPE_BUFFER_COMPLETED_SOFT: std::cout<< "Buffer completed"; break;
    case AL_EVENT_TYPE_SOURCE_STATE_CHANGED_SOFT: std::cout<< "Source state changed"; break;
    case AL_EVENT_TYPE_DISCONNECTED_SOFT: std::cout<< "Disconnected"; break;
    default:
        std::cout<< "0x"<<std::hex<<std::setw(4)<<std::setfill('0')<<eventType<<std::dec<<
            std::setw(0)<<std::setfill(' '); break;
    }
    std::cout<< "\n"
        "Object ID: "<<object<<"\n"
        "Parameter: "<<param<<"\n"
        "Message: "<<std::string{message, static_cast<ALuint>(length)}<<"\n----"<<
        std::endl;

    if(eventType == AL_EVENT_TYPE_DISCONNECTED_SOFT)
    {
        {
            std::lock_guard<std::mutex> lock{self->mSrcMutex};
            self->mConnected.clear(std::memory_order_release);
        }
        self->mSrcCond.notify_one();
    }
}